

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall mp::BasicSolver::ParseOptionString(BasicSolver *this,char *s,uint flags)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  CStringRef arg0;
  SolverOption *args;
  uint in_EDX;
  char *in_RSI;
  long *in_RDI;
  bool bVar5;
  bool in_stack_0000005f;
  char *in_stack_00000060;
  SolverOptionManager *in_stack_00000068;
  char next;
  SolverOption *opt;
  bool equal_sign;
  size_t i;
  size_t name_size;
  MemoryBuffer<char,_50UL,_std::allocator<char>_> name;
  char *name_start;
  allocator<char> *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  char in_stack_fffffffffffffe67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  BasicSolver *this_00;
  string local_138 [32];
  string local_118 [32];
  BasicCStringRef<char> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  BasicCStringRef<char> local_e8;
  string local_e0 [32];
  BasicCStringRef<char> local_c0;
  char local_b5;
  undefined4 local_b4;
  SolverOption *local_b0;
  byte local_a1;
  size_t local_a0;
  ulong local_98;
  allocator<char> local_79;
  Buffer<char> local_78 [2];
  char *local_20;
  uint local_14;
  char *local_10 [2];
  
  local_14 = in_EDX;
  local_10[0] = in_RSI;
  do {
    local_20 = SkipSpaces((char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    local_10[0] = local_20;
    if (*local_20 == '\0') {
      return;
    }
    while( true ) {
      bVar5 = false;
      if (*local_10[0] != '\0') {
        iVar2 = isspace((int)*local_10[0]);
        bVar5 = false;
        if (iVar2 == 0) {
          bVar5 = *local_10[0] != '=';
        }
      }
      if (!bVar5) break;
      local_10[0] = local_10[0] + 1;
    }
    std::allocator<char>::allocator();
    fmt::internal::MemoryBuffer<char,_50UL,_std::allocator<char>_>::MemoryBuffer
              ((MemoryBuffer<char,_50UL,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    std::allocator<char>::~allocator(&local_79);
    local_98 = (long)local_10[0] - (long)local_20;
    fmt::Buffer<char>::resize
              ((Buffer<char> *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (size_t)in_stack_fffffffffffffe58);
    for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
      cVar1 = local_20[local_a0];
      pcVar4 = fmt::Buffer<char>::operator[](local_78,local_a0);
      *pcVar4 = cVar1;
    }
    pcVar4 = fmt::Buffer<char>::operator[](local_78,local_98);
    *pcVar4 = '\0';
    local_a1 = 0;
    local_10[0] = SkipSpaces((char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    if (*local_10[0] == '=') {
      local_10[0] = SkipSpaces((char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60)
                              );
      local_a1 = 1;
    }
    this_00 = (BasicSolver *)(in_RDI + 5);
    arg0.data_ = fmt::Buffer<char>::operator[](local_78,0);
    args = SolverOptionManager::FindOption(in_stack_00000068,in_stack_00000060,in_stack_0000005f);
    local_b0 = args;
    if (args == (SolverOption *)0x0) {
      pcVar4 = fmt::Buffer<char>::operator[](local_78,0);
      (**(code **)(*in_RDI + 0x30))(in_RDI,pcVar4);
      local_b4 = 3;
    }
    else if ((*local_10[0] == '?') &&
            ((local_b5 = local_10[0][1], local_b5 == '\0' ||
             (iVar2 = isspace((int)local_b5), iVar2 != 0)))) {
      local_10[0] = local_10[0] + 1;
      if ((local_14 & 1) == 0) {
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_c0,"  {}\n");
        (*local_b0->_vptr_SolverOption[0xb])(local_e0);
        Print<std::__cxx11::string>
                  (this_00,arg0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        std::__cxx11::string::~string(local_e0);
      }
      local_b4 = 3;
    }
    else {
      if ((local_a1 & 1) == 0) {
        uVar3 = (*local_b0->_vptr_SolverOption[2])();
        in_stack_fffffffffffffe67 = (char)uVar3;
        if ((uVar3 & 1) == 0) {
          (*local_b0->_vptr_SolverOption[0xd])(local_b0,local_10,(ulong)((local_14 & 2) >> 1));
        }
        else {
          (*local_b0->_vptr_SolverOption[0xd])(local_b0,local_10,(ulong)((local_14 & 2) >> 1));
        }
      }
      else {
        uVar3 = (*local_b0->_vptr_SolverOption[2])();
        if ((uVar3 & 1) != 0) {
          fmt::BasicCStringRef<char>::BasicCStringRef
                    (&local_e8,"Option \"{}\" doesn\'t accept an argument");
          in_stack_fffffffffffffe68 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               fmt::Buffer<char>::operator[](local_78,0);
          local_f0 = in_stack_fffffffffffffe68;
          ReportError<char*>(this_00,arg0,(char **)args);
          local_10[0] = SkipNonSpaces((char *)CONCAT17(in_stack_fffffffffffffe67,
                                                       in_stack_fffffffffffffe60));
          local_b4 = 3;
          goto LAB_002c06b8;
        }
        (*local_b0->_vptr_SolverOption[0xd])(local_b0,local_10,(ulong)((local_14 & 2) >> 1));
      }
      if ((local_14 & 1) == 0) {
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_f8,"  {}");
        (*local_b0->_vptr_SolverOption[0xb])(local_138);
        std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe67);
        Print<std::__cxx11::string>
                  (this_00,arg0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        std::__cxx11::string::~string(local_118);
        std::__cxx11::string::~string(local_138);
      }
      local_b4 = 0;
    }
LAB_002c06b8:
    fmt::internal::MemoryBuffer<char,_50UL,_std::allocator<char>_>::~MemoryBuffer
              ((MemoryBuffer<char,_50UL,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  } while( true );
}

Assistant:

void BasicSolver::ParseOptionString(
    const char *s, unsigned flags) {
  for (;;) {
    if (!*(s = SkipSpaces(s)))
      return;

    // Parse the option name.
    const char *name_start = s;
    while (*s && !std::isspace(*s) && *s != '=')
      ++s;
    fmt::internal::MemoryBuffer<char, 50> name;
    std::size_t name_size = s - name_start;
    name.resize(name_size + 1);
    for (std::size_t i = 0; i < name_size; ++i)
      name[i] = name_start[i];
    name[name_size] = 0;

    // Check if we have an '=' sign,
    // skip all spaces intil next token.
    bool equal_sign = false;
    s = SkipSpaces(s);
    if (*s == '=') {
      s = SkipSpaces(s + 1);
      equal_sign = true;
    }

    // Parse option name.
    SolverOption *opt = FindOption(&name[0], true);
    if (!opt) {
      HandleUnknownOption(&name[0]);
      continue;       // in case it does not throw
    }

    // If user asks the default/current value.
    if (*s == '?') {
      char next = s[1];
      if (!next || std::isspace(next)) {
        ++s;
        if ((flags & NO_OPTION_ECHO) == 0) {
          Print("  {}\n", opt->echo_with_value());
        }
        continue;
      }
    }

    /// Parse value if needed.
    if (equal_sign) {
      // No '=' for flags.
      if (opt->is_flag()) {
        ReportError(
              "Option \"{}\" doesn't accept an argument",
              &name[0]);
        s = SkipNonSpaces(s);    // In case we go on
        continue;
      } else {
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      }
    } else {
      if (opt->is_flag()) {         // Might set some flag
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      } else {                      // Even w/o '=' sign
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      }
    }

    // Echo name [= value].
    if ((flags & NO_OPTION_ECHO) == 0) {
      Print("  {}", opt->echo_with_value() + '\n');
    }
  }
}